

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_rcpt_to(connectdata *conn)

{
  void *pvVar1;
  SMTP *smtp;
  Curl_easy *data;
  CURLcode result;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  if (*(char *)**(undefined8 **)((long)pvVar1 + 0x10) == '<') {
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"RCPT TO:%s",
                               **(undefined8 **)((long)pvVar1 + 0x10));
  }
  else {
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"RCPT TO:<%s>",
                               **(undefined8 **)((long)pvVar1 + 0x10));
  }
  if (data._4_4_ == CURLE_OK) {
    state(conn,SMTP_RCPT);
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_perform_rcpt_to(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct SMTP *smtp = data->req.protop;

  /* Send the RCPT TO command */
  if(smtp->rcpt->data[0] == '<')
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "RCPT TO:%s",
                           smtp->rcpt->data);
  else
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "RCPT TO:<%s>",
                           smtp->rcpt->data);
  if(!result)
    state(conn, SMTP_RCPT);

  return result;
}